

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_x87load(ASMState *as,IRRef ref)

{
  IRIns *pIVar1;
  ushort uVar2;
  int32_t ofs;
  Reg rb;
  MCode *pMVar3;
  
  pIVar1 = as->ir + ref;
  if ((pIVar1->field_1).o == '[') {
    if (((((pIVar1->field_0).op2 == 0x1d3) && ((char)(pIVar1->field_1).r < '\0')) &&
        ((pIVar1->field_1).s == '\0')) &&
       ((uVar2 = (pIVar1->field_0).op1, (short)uVar2 < 0 && (as->fuseref < (uint)uVar2)))) {
      ofs = ra_spill(as,as->ir + (uint)uVar2);
      emit_rmro(as,XO_FILDd,0,4,ofs);
      return;
    }
  }
  else if ((pIVar1->field_1).o == '\x1c') {
    if (pIVar1[1] == (IRIns)0x3ff0000000000000) {
      pMVar3 = as->mcp;
      pMVar3[-2] = 0xd9;
      pMVar3[-1] = 0xe8;
    }
    else {
      if (pIVar1[1] != (IRIns)0x0) {
        emit_rma(as,XO_FISTTPq,0,pIVar1 + 1);
        return;
      }
      pMVar3 = as->mcp;
      pMVar3[-2] = 0xd9;
      pMVar3[-1] = 0xee;
    }
    as->mcp = pMVar3 + -2;
    return;
  }
  rb = asm_fuseload(as,ref,0);
  emit_mrm(as,XO_FISTTPq,0,rb);
  return;
}

Assistant:

static void asm_x87load(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (ir->o == IR_KNUM) {
    cTValue *tv = ir_knum(ir);
    if (tvispzero(tv))  /* Use fldz only for +0. */
      emit_x87op(as, XI_FLDZ);
    else if (tvispone(tv))
      emit_x87op(as, XI_FLD1);
    else
      emit_rma(as, XO_FLDq, XOg_FLDq, tv);
  } else if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT && !ra_used(ir) &&
	     !irref_isk(ir->op1) && mayfuse(as, ir->op1)) {
    IRIns *iri = IR(ir->op1);
    emit_rmro(as, XO_FILDd, XOg_FILDd, RID_ESP, ra_spill(as, iri));
  } else {
    emit_mrm(as, XO_FLDq, XOg_FLDq, asm_fuseload(as, ref, RSET_EMPTY));
  }
}